

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall Fl_Text_Display::linenumber_format(Fl_Text_Display *this,char *val)

{
  return;
}

Assistant:

void Fl_Text_Display::linenumber_format(const char* val) {
#if FLTK_ABI_VERSION >= 10303
  if ( linenumber_format_ ) free((void*)linenumber_format_);
  linenumber_format_ = val ? strdup(val) : 0;
#else
  // do nothing
#endif
}